

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode Curl_socket_open(Curl_easy *data,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,int transport,
                         curl_socket_t *sockfd)

{
  CURLcode CVar1;
  Curl_sockaddr_ex *dest;
  Curl_sockaddr_ex dummy;
  Curl_sockaddr_ex CStack_a8;
  
  dest = &CStack_a8;
  if (addr != (Curl_sockaddr_ex *)0x0) {
    dest = addr;
  }
  Curl_sock_assign_addr(dest,ai,transport);
  CVar1 = socket_open(data,dest,sockfd);
  return CVar1;
}

Assistant:

CURLcode Curl_socket_open(struct Curl_easy *data,
                            const struct Curl_addrinfo *ai,
                            struct Curl_sockaddr_ex *addr,
                            int transport,
                            curl_socket_t *sockfd)
{
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  Curl_sock_assign_addr(addr, ai, transport);
  return socket_open(data, addr, sockfd);
}